

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O2

void okim6258_set_clock(void *chip,UINT32 clock)

{
  uint uVar1;
  ulong uVar2;
  okim6258_state *info;
  
  if (clock == 0) {
    clock = *(UINT32 *)((long)chip + 0x2e);
  }
  *(UINT32 *)((long)chip + 0xc) = clock;
  if (*(code **)((long)chip + 0x40) != (code *)0x0) {
    uVar1 = *(uint *)((long)chip + 0x10);
    uVar2 = (ulong)((uVar1 >> 1) + clock);
    (**(code **)((long)chip + 0x40))
              (*(undefined8 *)((long)chip + 0x48),uVar2 / uVar1,uVar2 % (ulong)uVar1);
    return;
  }
  return;
}

Assistant:

static void okim6258_set_clock(void *chip, UINT32 clock)
{
	okim6258_state *info = (okim6258_state *)chip;

	if (clock)
	{
		// set to specific value
		info->master_clock = clock;
	}
	else
	{
		// set to value from buffer
		info->master_clock =	(info->clock_buffer[0x00] <<  0) |
								(info->clock_buffer[0x01] <<  8) |
								(info->clock_buffer[0x02] << 16) |
								(info->clock_buffer[0x03] << 24);
	}
	if (info->SmpRateFunc != NULL)
		info->SmpRateFunc(info->SmpRateData, get_vclk(info));
}